

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O0

void __thiscall
pstore::index::
hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::clear(hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *this,index_pointer node,uint shifts)

{
  bool bVar1;
  index_pointer local_48;
  index_pointer p;
  iterator __end3;
  iterator __begin3;
  internal_node *__range3;
  internal_node *internal;
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *phStack_18;
  uint shifts_local;
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_local;
  index_pointer node_local;
  
  internal._4_4_ = shifts;
  phStack_18 = this;
  this_local = (hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)node;
  bVar1 = details::index_pointer::is_heap((index_pointer *)&this_local);
  if ((bVar1) && (bVar1 = details::index_pointer::is_leaf((index_pointer *)&this_local), !bVar1)) {
    bVar1 = details::depth_is_internal_node(internal._4_4_);
    if (bVar1) {
      __begin3 = (iterator)
                 details::index_pointer::untag<pstore::index::details::internal_node*,void>
                           ((index_pointer *)&this_local);
      __range3 = (internal_node *)__begin3;
      __end3 = details::internal_node::begin((internal_node *)&__begin3->addr_);
      p.internal_ = (internal_node *)details::internal_node::end((internal_node *)&__begin3->addr_);
      for (; __end3 != (iterator)p.internal_; __end3 = __end3 + 1) {
        local_48 = *__end3;
        bVar1 = details::index_pointer::is_heap((index_pointer *)&local_48.addr_);
        if (bVar1) {
          clear(this,local_48,internal._4_4_ + 6);
        }
      }
    }
    delete_node(this,(index_pointer)this_local,internal._4_4_);
    return;
  }
  assert_failed("node.is_heap () && !node.is_leaf ()",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/hamt_map.hpp"
                ,0x2a0);
}

Assistant:

void hamt_map<KeyType, ValueType, Hash, KeyEqual>::clear (index_pointer node,
                                                                  unsigned shifts) {
            PSTORE_ASSERT (node.is_heap () && !node.is_leaf ());
            if (details::depth_is_internal_node (shifts)) {
                auto * const internal = node.untag<internal_node *> ();
                // Recursively release the children of this internal node.
                for (auto p : *internal) {
                    if (p.is_heap ()) {
                        this->clear (p, shifts + details::hash_index_bits);
                    }
                }
            }

            this->delete_node (node, shifts);
        }